

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb::BitpackingCompressionState<unsigned_short,_true,_short>::BitpackingWriter::WriteFor
               (unsigned_short *values,bool *validity,bitpacking_width_t width,
               unsigned_short frame_of_reference,idx_t count,void *data_ptr)

{
  int iVar1;
  int iVar2;
  long lVar3;
  unsigned_long uVar4;
  idx_t iVar5;
  ulong uVar6;
  unsigned_short *puVar7;
  bitpacking_metadata_encoded_t encoded_value;
  uint16_t *puVar8;
  ulong uVar9;
  unsigned_short *in;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint16_t local_78 [16];
  uint16_t local_58 [20];
  
  iVar5 = count;
  if ((count & 0x1f) != 0) {
    uVar4 = NumericCastImpl<unsigned_long,_int,_false>::Convert((uint)count & 0x1f);
    iVar5 = (count - uVar4) + 0x20;
  }
  uVar12 = (ulong)width;
  uVar6 = iVar5 * uVar12 >> 3;
  FlushAndCreateSegmentIfFull
            ((BitpackingCompressionState<unsigned_short,_true,_short> *)data_ptr,uVar6 + 4,4);
  iVar1 = *(int *)((long)data_ptr + 0x40);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)((long)data_ptr + 0x38));
  iVar2 = *(int *)(*(long *)((long)data_ptr + 0x38) + 0x10);
  lVar3 = *(long *)((long)data_ptr + 0x48);
  *(long *)((long)data_ptr + 0x48) = lVar3 + -4;
  *(uint *)(lVar3 + -4) = iVar1 - iVar2 | 0x5000000;
  puVar7 = *(unsigned_short **)((long)data_ptr + 0x40);
  *puVar7 = frame_of_reference;
  *(unsigned_short **)((long)data_ptr + 0x40) = puVar7 + 1;
  puVar7[1] = (ushort)width;
  puVar7 = puVar7 + 2;
  *(unsigned_short **)((long)data_ptr + 0x40) = puVar7;
  uVar9 = count & 0xffffffffffffffe0;
  if (uVar9 != 0) {
    uVar10 = 0;
    uVar11 = 0;
    in = values;
    do {
      puVar8 = (uint16_t *)((uVar10 >> 3) + (long)puVar7);
      duckdb_fastpforlib::internal::fastpack_half(in,puVar8,(uint)width);
      duckdb_fastpforlib::internal::fastpack_half(in + 0x10,puVar8 + uVar12,(uint)width);
      uVar11 = uVar11 + 0x20;
      in = in + 0x20;
      uVar10 = uVar10 + (ulong)width * 0x20;
    } while (uVar11 < uVar9);
  }
  if ((count & 0x1f) != 0) {
    uVar10 = (ulong)(((uint)count & 0x1f) * 2);
    switchD_0105b559::default((void *)((long)local_78 + uVar10),0,0x40 - uVar10);
    switchD_015ff80e::default(local_78,values + uVar9,uVar10);
    puVar8 = (uint16_t *)((long)puVar7 + (uVar9 * uVar12 >> 3));
    duckdb_fastpforlib::internal::fastpack_half(local_78,puVar8,(uint)width);
    duckdb_fastpforlib::internal::fastpack_half(local_58,puVar8 + uVar12,(uint)width);
  }
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + uVar6;
  UpdateStats((BitpackingCompressionState<unsigned_short,_true,_short> *)data_ptr,count);
  return;
}

Assistant:

static void WriteFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference, idx_t count,
		                     void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 2 * sizeof(T));

			WriteMetaData(state, BitpackingMode::FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, (T)width);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}